

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void fadst16x16_sse4_1(__m128i *in,__m128i *out,int bit,int num_cols)

{
  int *piVar1;
  int *piVar2;
  undefined8 *puVar3;
  int *piVar4;
  int *piVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  int iVar13;
  undefined4 uVar14;
  int iVar15;
  undefined4 uVar16;
  int iVar17;
  undefined4 uVar18;
  int iVar19;
  undefined4 uVar20;
  int iVar21;
  undefined4 uVar22;
  int iVar23;
  undefined4 uVar24;
  int iVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  ulong uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long lVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar61;
  int iVar62;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar63;
  int iVar71;
  int iVar73;
  undefined1 auVar65 [16];
  int iVar64;
  int iVar72;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar79;
  int iVar80;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int iVar92;
  int iVar98;
  int iVar100;
  undefined1 auVar94 [16];
  int iVar93;
  int iVar99;
  int iVar101;
  int iVar102;
  int iVar103;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  int iVar104;
  int iVar110;
  int iVar114;
  int iVar118;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  int iVar111;
  int iVar112;
  int iVar113;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar119;
  int iVar120;
  int iVar121;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  int iVar122;
  int iVar127;
  int iVar128;
  int iVar129;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  int iVar133;
  int iVar141;
  int iVar142;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  int iVar143;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  int iVar144;
  int iVar150;
  int iVar151;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  int iVar152;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  int iVar156;
  int iVar157;
  undefined1 auVar153 [16];
  int iVar158;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  int local_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  
  uVar29 = (ulong)(uint)num_cols;
  iVar41 = 1 << ((char)bit - 1U & 0x1f);
  if (0 < num_cols) {
    lVar40 = (long)bit * 0x100;
    uVar6 = *(undefined4 *)((long)vert_filter_length_chroma + lVar40 + 0x1e0);
    iVar7 = *(int *)((long)vert_filter_length_chroma + lVar40 + 0x220);
    iVar8 = *(int *)((long)vert_filter_length_chroma + lVar40 + 0x1a0);
    iVar50 = -iVar8;
    iVar42 = -iVar7;
    iVar9 = *(int *)((long)vert_filter_length_chroma + lVar40 + 0x168);
    iVar10 = *(int *)((long)vert_filter_length_chroma + lVar40 + 0x180);
    iVar11 = *(int *)((long)vert_filter_length_chroma + lVar40 + 0x240);
    iVar53 = -iVar11;
    iVar51 = -iVar10;
    uVar12 = *(undefined4 *)((long)vert_filter_length_chroma + lVar40 + 0x1c0);
    iVar13 = *(int *)((long)vert_filter_length_chroma + lVar40 + 0x200);
    iVar52 = -iVar13;
    uVar14 = *(undefined4 *)((long)vert_filter_length_chroma + lVar40 + 600);
    iVar43 = -iVar9;
    iVar15 = *(int *)((long)vert_filter_length_chroma + lVar40 + 0x188);
    uVar16 = *(undefined4 *)((long)vert_filter_length_chroma + lVar40 + 0x238);
    iVar44 = -iVar15;
    iVar17 = *(int *)((long)vert_filter_length_chroma + lVar40 + 0x1a8);
    uVar18 = *(undefined4 *)((long)vert_filter_length_chroma + lVar40 + 0x218);
    iVar45 = -iVar17;
    iVar19 = *(int *)((long)vert_filter_length_chroma + lVar40 + 0x1c8);
    uVar20 = *(undefined4 *)((long)vert_filter_length_chroma + lVar40 + 0x1f8);
    iVar46 = -iVar19;
    iVar21 = *(int *)((long)vert_filter_length_chroma + lVar40 + 0x1e8);
    uVar22 = *(undefined4 *)((long)vert_filter_length_chroma + lVar40 + 0x1d8);
    iVar47 = -iVar21;
    iVar23 = *(int *)((long)vert_filter_length_chroma + lVar40 + 0x208);
    uVar24 = *(undefined4 *)((long)vert_filter_length_chroma + lVar40 + 0x1b8);
    iVar48 = -iVar23;
    iVar25 = *(int *)((long)vert_filter_length_chroma + lVar40 + 0x228);
    uVar26 = *(undefined4 *)((long)vert_filter_length_chroma + lVar40 + 0x198);
    iVar49 = -iVar25;
    uVar27 = *(undefined4 *)((long)vert_filter_length_chroma + lVar40 + 0x248);
    uVar28 = *(undefined4 *)((long)vert_filter_length_chroma + lVar40 + 0x178);
    lVar40 = 0;
    do {
      piVar1 = (int *)((long)*in + lVar40);
      piVar2 = (int *)((long)in[(uint)(num_cols * 0xf)] + lVar40);
      puVar3 = (undefined8 *)((long)in[(uint)(num_cols * 3)] + lVar40);
      uVar30 = *puVar3;
      uVar31 = puVar3[1];
      local_408 = (int)uVar30;
      iStack_404 = (int)((ulong)uVar30 >> 0x20);
      iStack_400 = (int)uVar31;
      iStack_3fc = (int)((ulong)uVar31 >> 0x20);
      piVar4 = (int *)((long)in[(uint)(num_cols * 0xc)] + lVar40);
      auVar39._4_4_ = uVar6;
      auVar39._0_4_ = uVar6;
      auVar39._8_4_ = uVar6;
      auVar39._12_4_ = uVar6;
      auVar65 = pmulld(*(undefined1 (*) [16])((long)in[(uint)(num_cols * 7)] + lVar40),auVar39);
      auVar94 = pmulld(*(undefined1 (*) [16])((long)in[(uint)(num_cols * 8)] + lVar40),auVar39);
      auVar162 = ZEXT416((uint)bit);
      iVar79 = (iVar41 - auVar65._0_4_) + auVar94._0_4_ >> auVar162;
      iVar86 = (iVar41 - auVar65._4_4_) + auVar94._4_4_ >> auVar162;
      iVar88 = (iVar41 - auVar65._8_4_) + auVar94._8_4_ >> auVar162;
      iVar90 = (iVar41 - auVar65._12_4_) + auVar94._12_4_ >> auVar162;
      iVar63 = iVar41 - (auVar94._0_4_ + auVar65._0_4_) >> auVar162;
      iVar71 = iVar41 - (auVar94._4_4_ + auVar65._4_4_) >> auVar162;
      iVar73 = iVar41 - (auVar94._8_4_ + auVar65._8_4_) >> auVar162;
      iVar76 = iVar41 - (auVar94._12_4_ + auVar65._12_4_) >> auVar162;
      auVar65 = pmulld(*(undefined1 (*) [16])((long)in[(uint)(num_cols * 4)] + lVar40),auVar39);
      auVar94 = pmulld(*(undefined1 (*) [16])((long)in[(uint)(num_cols * 0xb)] + lVar40),auVar39);
      iVar64 = auVar65._0_4_ + iVar41;
      iVar72 = auVar65._4_4_ + iVar41;
      iVar74 = auVar65._8_4_ + iVar41;
      iVar77 = auVar65._12_4_ + iVar41;
      iVar104 = iVar64 - auVar94._0_4_ >> auVar162;
      iVar110 = iVar72 - auVar94._4_4_ >> auVar162;
      iVar114 = iVar74 - auVar94._8_4_ >> auVar162;
      iVar118 = iVar77 - auVar94._12_4_ >> auVar162;
      iVar64 = iVar64 + auVar94._0_4_ >> auVar162;
      iVar72 = iVar72 + auVar94._4_4_ >> auVar162;
      iVar75 = iVar74 + auVar94._8_4_ >> auVar162;
      iVar78 = iVar77 + auVar94._12_4_ >> auVar162;
      auVar65 = pmulld(*(undefined1 (*) [16])((long)in[(uint)(num_cols * 6)] + lVar40),auVar39);
      auVar94 = pmulld(*(undefined1 (*) [16])((long)in[(uint)(num_cols * 9)] + lVar40),auVar39);
      iVar92 = auVar65._0_4_ + iVar41;
      iVar98 = auVar65._4_4_ + iVar41;
      iVar100 = auVar65._8_4_ + iVar41;
      iVar102 = auVar65._12_4_ + iVar41;
      iVar74 = iVar92 - auVar94._0_4_ >> auVar162;
      iVar77 = iVar98 - auVar94._4_4_ >> auVar162;
      iVar61 = iVar100 - auVar94._8_4_ >> auVar162;
      iVar62 = iVar102 - auVar94._12_4_ >> auVar162;
      piVar5 = (int *)((long)in[uVar29] + lVar40);
      iVar93 = iVar92 + auVar94._0_4_ >> auVar162;
      iVar99 = iVar98 + auVar94._4_4_ >> auVar162;
      iVar101 = iVar100 + auVar94._8_4_ >> auVar162;
      iVar103 = iVar102 + auVar94._12_4_ >> auVar162;
      puVar3 = (undefined8 *)((long)in[(uint)(num_cols * 0xe)] + lVar40);
      uVar30 = *puVar3;
      uVar31 = puVar3[1];
      auVar65 = pmulld(*(undefined1 (*) [16])((long)in[(uint)(num_cols * 5)] + lVar40),auVar39);
      auVar94 = pmulld(*(undefined1 (*) [16])((long)in[(uint)(num_cols * 10)] + lVar40),auVar39);
      iVar122 = iVar79 + *piVar1;
      iVar127 = iVar86 + piVar1[1];
      iVar128 = iVar88 + piVar1[2];
      iVar129 = iVar90 + piVar1[3];
      iVar79 = *piVar1 - iVar79;
      iVar86 = piVar1[1] - iVar86;
      iVar88 = piVar1[2] - iVar88;
      iVar90 = piVar1[3] - iVar90;
      iVar80 = iVar63 - *piVar2;
      iVar87 = iVar71 - piVar2[1];
      iVar89 = iVar73 - piVar2[2];
      iVar91 = iVar76 - piVar2[3];
      iVar63 = iVar63 + *piVar2;
      iVar71 = iVar71 + piVar2[1];
      iVar73 = iVar73 + piVar2[2];
      iVar76 = iVar76 + piVar2[3];
      auVar130._0_4_ = iVar104 - local_408;
      auVar130._4_4_ = iVar110 - iStack_404;
      auVar130._8_4_ = iVar114 - iStack_400;
      auVar130._12_4_ = iVar118 - iStack_3fc;
      auVar123._4_4_ = -(iVar110 + iStack_404);
      auVar123._0_4_ = -(iVar104 + local_408);
      auVar123._8_4_ = -(iVar114 + iStack_400);
      auVar123._12_4_ = -(iVar118 + iStack_3fc);
      auVar54._0_4_ = iVar64 + *piVar4;
      auVar54._4_4_ = iVar72 + piVar4[1];
      auVar54._8_4_ = iVar75 + piVar4[2];
      auVar54._12_4_ = iVar78 + piVar4[3];
      auVar134._0_4_ = *piVar4 - iVar64;
      auVar134._4_4_ = piVar4[1] - iVar72;
      auVar134._8_4_ = piVar4[2] - iVar75;
      auVar134._12_4_ = piVar4[3] - iVar78;
      iVar64 = iVar74 - *piVar5;
      iVar72 = iVar77 - piVar5[1];
      iVar92 = iVar61 - piVar5[2];
      iVar100 = iVar62 - piVar5[3];
      iVar74 = iVar74 + *piVar5;
      iVar77 = iVar77 + piVar5[1];
      iVar61 = iVar61 + piVar5[2];
      iVar62 = iVar62 + piVar5[3];
      local_3d8 = (int)uVar30;
      iStack_3d4 = (int)((ulong)uVar30 >> 0x20);
      iStack_3d0 = (int)uVar31;
      iStack_3cc = (int)((ulong)uVar31 >> 0x20);
      iVar75 = iVar93 + local_3d8;
      iVar78 = iVar99 + iStack_3d4;
      iVar98 = iVar101 + iStack_3d0;
      iVar102 = iVar103 + iStack_3cc;
      local_3d8 = local_3d8 - iVar93;
      iStack_3d4 = iStack_3d4 - iVar99;
      iStack_3d0 = iStack_3d0 - iVar101;
      iStack_3cc = iStack_3cc - iVar103;
      piVar1 = (int *)((long)in[(uint)(num_cols * 2)] + lVar40);
      iVar93 = (iVar41 - auVar65._0_4_) + auVar94._0_4_ >> auVar162;
      iVar99 = (iVar41 - auVar65._4_4_) + auVar94._4_4_ >> auVar162;
      iVar101 = (iVar41 - auVar65._8_4_) + auVar94._8_4_ >> auVar162;
      iVar103 = (iVar41 - auVar65._12_4_) + auVar94._12_4_ >> auVar162;
      auVar81._0_4_ = iVar93 + *piVar1;
      auVar81._4_4_ = iVar99 + piVar1[1];
      auVar81._8_4_ = iVar101 + piVar1[2];
      auVar81._12_4_ = iVar103 + piVar1[3];
      auVar58._0_4_ = *piVar1 - iVar93;
      auVar58._4_4_ = piVar1[1] - iVar99;
      auVar58._8_4_ = piVar1[2] - iVar101;
      auVar58._12_4_ = piVar1[3] - iVar103;
      iVar93 = iVar41 - (auVar94._0_4_ + auVar65._0_4_) >> auVar162;
      iVar99 = iVar41 - (auVar94._4_4_ + auVar65._4_4_) >> auVar162;
      iVar101 = iVar41 - (auVar94._8_4_ + auVar65._8_4_) >> auVar162;
      iVar103 = iVar41 - (auVar94._12_4_ + auVar65._12_4_) >> auVar162;
      piVar1 = (int *)((long)in[(uint)(num_cols * 0xd)] + lVar40);
      auVar163._0_4_ = iVar93 - *piVar1;
      auVar163._4_4_ = iVar99 - piVar1[1];
      auVar163._8_4_ = iVar101 - piVar1[2];
      auVar163._12_4_ = iVar103 - piVar1[3];
      auVar105._4_4_ = -(iVar99 + piVar1[1]);
      auVar105._0_4_ = -(iVar93 + *piVar1);
      auVar105._8_4_ = -(iVar101 + piVar1[2]);
      auVar105._12_4_ = -(iVar103 + piVar1[3]);
      auVar37._4_4_ = iVar8;
      auVar37._0_4_ = iVar8;
      auVar37._8_4_ = iVar8;
      auVar37._12_4_ = iVar8;
      auVar145 = pmulld(auVar130,auVar37);
      auVar38._4_4_ = iVar7;
      auVar38._0_4_ = iVar7;
      auVar38._8_4_ = iVar7;
      auVar38._12_4_ = iVar7;
      auVar66 = pmulld(auVar54,auVar38);
      auVar131 = pmulld(auVar130,auVar38);
      auVar36._4_4_ = iVar50;
      auVar36._0_4_ = iVar50;
      auVar36._8_4_ = iVar50;
      auVar36._12_4_ = iVar50;
      auVar65 = pmulld(auVar54,auVar36);
      auVar67._4_4_ = iVar42;
      auVar67._0_4_ = iVar42;
      auVar67._8_4_ = iVar42;
      auVar67._12_4_ = iVar42;
      auVar94 = pmulld(auVar67,auVar123);
      auVar153 = pmulld(auVar134,auVar37);
      auVar124 = pmulld(auVar123,auVar37);
      auVar135 = pmulld(auVar134,auVar38);
      auVar67 = pmulld(auVar81,auVar37);
      auVar55 = pmulld(auVar163,auVar38);
      auVar82 = pmulld(auVar81,auVar38);
      auVar164 = pmulld(auVar163,auVar36);
      auVar106._4_4_ = iVar42;
      auVar106._0_4_ = iVar42;
      auVar106._8_4_ = iVar42;
      auVar106._12_4_ = iVar42;
      auVar56 = pmulld(auVar58,auVar106);
      auVar125 = pmulld(auVar37,auVar105);
      auVar59 = pmulld(auVar58,auVar37);
      auVar106 = pmulld(auVar105,auVar38);
      iVar93 = auVar145._0_4_ + iVar41 + auVar66._0_4_ >> auVar162;
      iVar99 = auVar145._4_4_ + iVar41 + auVar66._4_4_ >> auVar162;
      iVar101 = auVar145._8_4_ + iVar41 + auVar66._8_4_ >> auVar162;
      iVar103 = auVar145._12_4_ + iVar41 + auVar66._12_4_ >> auVar162;
      iVar104 = iVar93 + iVar122;
      iVar111 = iVar99 + iVar127;
      iVar115 = iVar101 + iVar128;
      iVar119 = iVar103 + iVar129;
      iVar122 = iVar122 - iVar93;
      iVar127 = iVar127 - iVar99;
      iVar128 = iVar128 - iVar101;
      iVar129 = iVar129 - iVar103;
      iVar93 = auVar131._0_4_ + iVar41 + auVar65._0_4_ >> auVar162;
      iVar99 = auVar131._4_4_ + iVar41 + auVar65._4_4_ >> auVar162;
      iVar101 = auVar131._8_4_ + iVar41 + auVar65._8_4_ >> auVar162;
      iVar103 = auVar131._12_4_ + iVar41 + auVar65._12_4_ >> auVar162;
      iVar118 = auVar153._0_4_ + iVar41 + auVar94._0_4_ >> auVar162;
      iVar156 = auVar153._4_4_ + iVar41 + auVar94._4_4_ >> auVar162;
      iVar157 = auVar153._8_4_ + iVar41 + auVar94._8_4_ >> auVar162;
      iVar158 = auVar153._12_4_ + iVar41 + auVar94._12_4_ >> auVar162;
      iVar110 = iVar93 + iVar80;
      iVar112 = iVar99 + iVar87;
      iVar116 = iVar101 + iVar89;
      iVar120 = iVar103 + iVar91;
      iVar80 = iVar80 - iVar93;
      iVar87 = iVar87 - iVar99;
      iVar89 = iVar89 - iVar101;
      iVar91 = iVar91 - iVar103;
      iVar114 = iVar118 + iVar79;
      iVar113 = iVar156 + iVar86;
      iVar117 = iVar157 + iVar88;
      iVar121 = iVar158 + iVar90;
      iVar79 = iVar79 - iVar118;
      iVar86 = iVar86 - iVar156;
      iVar88 = iVar88 - iVar157;
      iVar90 = iVar90 - iVar158;
      iVar133 = auVar135._0_4_ + iVar41 + auVar124._0_4_ >> auVar162;
      iVar141 = auVar135._4_4_ + iVar41 + auVar124._4_4_ >> auVar162;
      iVar142 = auVar135._8_4_ + iVar41 + auVar124._8_4_ >> auVar162;
      iVar143 = auVar135._12_4_ + iVar41 + auVar124._12_4_ >> auVar162;
      iVar118 = iVar133 - iVar63;
      iVar156 = iVar141 - iVar71;
      iVar157 = iVar142 - iVar73;
      iVar158 = iVar143 - iVar76;
      iVar133 = iVar133 + iVar63;
      iVar141 = iVar141 + iVar71;
      iVar142 = iVar142 + iVar73;
      iVar143 = iVar143 + iVar76;
      iVar63 = auVar67._0_4_ + iVar41 + auVar55._0_4_ >> auVar162;
      iVar71 = auVar67._4_4_ + iVar41 + auVar55._4_4_ >> auVar162;
      iVar73 = auVar67._8_4_ + iVar41 + auVar55._8_4_ >> auVar162;
      iVar76 = auVar67._12_4_ + iVar41 + auVar55._12_4_ >> auVar162;
      auVar146._0_4_ = iVar63 + iVar64;
      auVar146._4_4_ = iVar71 + iVar72;
      auVar146._8_4_ = iVar73 + iVar92;
      auVar146._12_4_ = iVar76 + iVar100;
      auVar168._0_4_ = iVar64 - iVar63;
      auVar168._4_4_ = iVar72 - iVar71;
      auVar168._8_4_ = iVar92 - iVar73;
      auVar168._12_4_ = iVar100 - iVar76;
      iVar73 = auVar82._0_4_ + iVar41 + auVar164._0_4_ >> auVar162;
      iVar92 = auVar82._4_4_ + iVar41 + auVar164._4_4_ >> auVar162;
      iVar76 = auVar82._8_4_ + iVar41 + auVar164._8_4_ >> auVar162;
      iVar100 = auVar82._12_4_ + iVar41 + auVar164._12_4_ >> auVar162;
      iVar63 = auVar56._0_4_ + iVar41 + auVar125._0_4_ >> auVar162;
      iVar64 = auVar56._4_4_ + iVar41 + auVar125._4_4_ >> auVar162;
      iVar71 = auVar56._8_4_ + iVar41 + auVar125._8_4_ >> auVar162;
      iVar72 = auVar56._12_4_ + iVar41 + auVar125._12_4_ >> auVar162;
      auVar126._0_4_ = iVar73 + iVar75;
      auVar126._4_4_ = iVar92 + iVar78;
      auVar126._8_4_ = iVar76 + iVar98;
      auVar126._12_4_ = iVar100 + iVar102;
      auVar136._0_4_ = iVar75 - iVar73;
      auVar136._4_4_ = iVar78 - iVar92;
      auVar136._8_4_ = iVar98 - iVar76;
      auVar136._12_4_ = iVar102 - iVar100;
      auVar68._0_4_ = iVar63 - iVar74;
      auVar68._4_4_ = iVar64 - iVar77;
      auVar68._8_4_ = iVar71 - iVar61;
      auVar68._12_4_ = iVar72 - iVar62;
      auVar57._0_4_ = iVar63 + iVar74;
      auVar57._4_4_ = iVar64 + iVar77;
      auVar57._8_4_ = iVar71 + iVar61;
      auVar57._12_4_ = iVar72 + iVar62;
      iVar63 = auVar59._0_4_ + iVar41 + auVar106._0_4_ >> auVar162;
      iVar64 = auVar59._4_4_ + iVar41 + auVar106._4_4_ >> auVar162;
      iVar71 = auVar59._8_4_ + iVar41 + auVar106._8_4_ >> auVar162;
      iVar72 = auVar59._12_4_ + iVar41 + auVar106._12_4_ >> auVar162;
      auVar95._0_4_ = iVar63 + local_3d8;
      auVar95._4_4_ = iVar64 + iStack_3d4;
      auVar95._8_4_ = iVar71 + iStack_3d0;
      auVar95._12_4_ = iVar72 + iStack_3cc;
      auVar165._0_4_ = local_3d8 - iVar63;
      auVar165._4_4_ = iStack_3d4 - iVar64;
      auVar165._8_4_ = iStack_3d0 - iVar71;
      auVar165._12_4_ = iStack_3cc - iVar72;
      auVar35._4_4_ = iVar10;
      auVar35._0_4_ = iVar10;
      auVar35._8_4_ = iVar10;
      auVar35._12_4_ = iVar10;
      auVar94 = pmulld(auVar146,auVar35);
      auVar34._4_4_ = iVar11;
      auVar34._0_4_ = iVar11;
      auVar34._8_4_ = iVar11;
      auVar34._12_4_ = iVar11;
      auVar56 = pmulld(auVar126,auVar34);
      auVar145 = pmulld(auVar146,auVar34);
      auVar32._4_4_ = iVar51;
      auVar32._0_4_ = iVar51;
      auVar32._8_4_ = iVar51;
      auVar32._12_4_ = iVar51;
      auVar106 = pmulld(auVar126,auVar32);
      auVar160._4_4_ = iVar13;
      auVar160._0_4_ = iVar13;
      auVar160._8_4_ = iVar13;
      auVar160._12_4_ = iVar13;
      auVar59 = pmulld(auVar68,auVar160);
      auVar170._4_4_ = uVar12;
      auVar170._0_4_ = uVar12;
      auVar170._8_4_ = uVar12;
      auVar170._12_4_ = uVar12;
      auVar82 = pmulld(auVar95,auVar170);
      auVar55 = pmulld(auVar68,auVar170);
      auVar167._4_4_ = iVar52;
      auVar167._0_4_ = iVar52;
      auVar167._8_4_ = iVar52;
      auVar167._12_4_ = iVar52;
      auVar66 = pmulld(auVar95,auVar167);
      auVar33._4_4_ = iVar53;
      auVar33._0_4_ = iVar53;
      auVar33._8_4_ = iVar53;
      auVar33._12_4_ = iVar53;
      auVar67 = pmulld(auVar168,auVar33);
      auVar124 = pmulld(auVar136,auVar35);
      auVar164 = pmulld(auVar168,auVar35);
      auVar131 = pmulld(auVar136,auVar34);
      auVar125 = pmulld(auVar160,auVar57);
      auVar65 = pmulld(auVar57,auVar170);
      auVar135 = pmulld(auVar165,auVar160);
      auVar153 = pmulld(auVar165,auVar170);
      iVar74 = auVar94._0_4_ + iVar41 + auVar56._0_4_ >> auVar162;
      iVar77 = auVar94._4_4_ + iVar41 + auVar56._4_4_ >> auVar162;
      iVar61 = auVar94._8_4_ + iVar41 + auVar56._8_4_ >> auVar162;
      iVar62 = auVar94._12_4_ + iVar41 + auVar56._12_4_ >> auVar162;
      iVar144 = auVar145._0_4_ + iVar41 + auVar106._0_4_ >> auVar162;
      iVar150 = auVar145._4_4_ + iVar41 + auVar106._4_4_ >> auVar162;
      iVar151 = auVar145._8_4_ + iVar41 + auVar106._8_4_ >> auVar162;
      iVar152 = auVar145._12_4_ + iVar41 + auVar106._12_4_ >> auVar162;
      auVar137._0_4_ = iVar74 + iVar104;
      auVar137._4_4_ = iVar77 + iVar111;
      auVar137._8_4_ = iVar61 + iVar115;
      auVar137._12_4_ = iVar62 + iVar119;
      auVar154._0_4_ = iVar144 + iVar110;
      auVar154._4_4_ = iVar150 + iVar112;
      auVar154._8_4_ = iVar151 + iVar116;
      auVar154._12_4_ = iVar152 + iVar120;
      iVar98 = auVar59._0_4_ + iVar41 + auVar82._0_4_ >> auVar162;
      iVar76 = auVar59._4_4_ + iVar41 + auVar82._4_4_ >> auVar162;
      iVar100 = auVar59._8_4_ + iVar41 + auVar82._8_4_ >> auVar162;
      iVar102 = auVar59._12_4_ + iVar41 + auVar82._12_4_ >> auVar162;
      auVar166._0_4_ = iVar98 + iVar114;
      auVar166._4_4_ = iVar76 + iVar113;
      auVar166._8_4_ = iVar100 + iVar117;
      auVar166._12_4_ = iVar102 + iVar121;
      iVar75 = auVar55._0_4_ + iVar41 + auVar66._0_4_ >> auVar162;
      iVar78 = auVar55._4_4_ + iVar41 + auVar66._4_4_ >> auVar162;
      iVar73 = auVar55._8_4_ + iVar41 + auVar66._8_4_ >> auVar162;
      iVar92 = auVar55._12_4_ + iVar41 + auVar66._12_4_ >> auVar162;
      auVar83._0_4_ = iVar75 + iVar118;
      auVar83._4_4_ = iVar78 + iVar156;
      auVar83._8_4_ = iVar73 + iVar157;
      auVar83._12_4_ = iVar92 + iVar158;
      iVar93 = auVar67._0_4_ + iVar41 + auVar124._0_4_ >> auVar162;
      iVar99 = auVar67._4_4_ + iVar41 + auVar124._4_4_ >> auVar162;
      iVar101 = auVar67._8_4_ + iVar41 + auVar124._8_4_ >> auVar162;
      iVar103 = auVar67._12_4_ + iVar41 + auVar124._12_4_ >> auVar162;
      iVar63 = auVar164._0_4_ + iVar41 + auVar131._0_4_ >> auVar162;
      iVar64 = auVar164._4_4_ + iVar41 + auVar131._4_4_ >> auVar162;
      iVar71 = auVar164._8_4_ + iVar41 + auVar131._8_4_ >> auVar162;
      iVar72 = auVar164._12_4_ + iVar41 + auVar131._12_4_ >> auVar162;
      auVar169._0_4_ = iVar93 + iVar122;
      auVar169._4_4_ = iVar99 + iVar127;
      auVar169._8_4_ = iVar101 + iVar128;
      auVar169._12_4_ = iVar103 + iVar129;
      auVar159._0_4_ = iVar63 + iVar80;
      auVar159._4_4_ = iVar64 + iVar87;
      auVar159._8_4_ = iVar71 + iVar89;
      auVar159._12_4_ = iVar72 + iVar91;
      auVar60._0_4_ = iVar80 - iVar63;
      auVar60._4_4_ = iVar87 - iVar64;
      auVar60._8_4_ = iVar89 - iVar71;
      auVar60._12_4_ = iVar91 - iVar72;
      iVar63 = auVar65._0_4_ + iVar41 + auVar135._0_4_ >> auVar162;
      iVar64 = auVar65._4_4_ + iVar41 + auVar135._4_4_ >> auVar162;
      iVar71 = auVar65._8_4_ + iVar41 + auVar135._8_4_ >> auVar162;
      iVar72 = auVar65._12_4_ + iVar41 + auVar135._12_4_ >> auVar162;
      auVar96._0_4_ = iVar63 + iVar79;
      auVar96._4_4_ = iVar64 + iVar86;
      auVar96._8_4_ = iVar71 + iVar88;
      auVar96._12_4_ = iVar72 + iVar90;
      iVar80 = (iVar41 - auVar125._0_4_) + auVar153._0_4_ >> auVar162;
      iVar87 = (iVar41 - auVar125._4_4_) + auVar153._4_4_ >> auVar162;
      iVar89 = (iVar41 - auVar125._8_4_) + auVar153._8_4_ >> auVar162;
      iVar91 = (iVar41 - auVar125._12_4_) + auVar153._12_4_ >> auVar162;
      auVar147._0_4_ = iVar80 - iVar133;
      auVar147._4_4_ = iVar87 - iVar141;
      auVar147._8_4_ = iVar89 - iVar142;
      auVar147._12_4_ = iVar91 - iVar143;
      auVar132._0_4_ = iVar80 + iVar133;
      auVar132._4_4_ = iVar87 + iVar141;
      auVar132._8_4_ = iVar89 + iVar142;
      auVar132._12_4_ = iVar91 + iVar143;
      auVar107._4_4_ = iVar9;
      auVar107._0_4_ = iVar9;
      auVar107._8_4_ = iVar9;
      auVar107._12_4_ = iVar9;
      auVar67 = pmulld(auVar137,auVar107);
      auVar138._4_4_ = uVar14;
      auVar138._0_4_ = uVar14;
      auVar138._8_4_ = uVar14;
      auVar138._12_4_ = uVar14;
      auVar107 = pmulld(auVar154,auVar138);
      auVar138 = pmulld(auVar137,auVar138);
      auVar155._4_4_ = iVar43;
      auVar155._0_4_ = iVar43;
      auVar155._8_4_ = iVar43;
      auVar155._12_4_ = iVar43;
      auVar155 = pmulld(auVar154,auVar155);
      auVar108._4_4_ = iVar15;
      auVar108._0_4_ = iVar15;
      auVar108._8_4_ = iVar15;
      auVar108._12_4_ = iVar15;
      auVar106 = pmulld(auVar166,auVar108);
      auVar109._4_4_ = uVar16;
      auVar109._0_4_ = uVar16;
      auVar109._8_4_ = uVar16;
      auVar109._12_4_ = uVar16;
      auVar108 = pmulld(auVar83,auVar109);
      auVar167 = pmulld(auVar166,auVar109);
      auVar84._4_4_ = iVar44;
      auVar84._0_4_ = iVar44;
      auVar84._8_4_ = iVar44;
      auVar84._12_4_ = iVar44;
      auVar84 = pmulld(auVar83,auVar84);
      auVar69._4_4_ = iVar17;
      auVar69._0_4_ = iVar17;
      auVar69._8_4_ = iVar17;
      auVar69._12_4_ = iVar17;
      auVar69 = pmulld(auVar169,auVar69);
      auVar149._4_4_ = uVar18;
      auVar149._0_4_ = uVar18;
      auVar149._8_4_ = uVar18;
      auVar149._12_4_ = uVar18;
      auVar109 = pmulld(auVar159,auVar149);
      auVar170 = pmulld(auVar169,auVar149);
      auVar139._4_4_ = iVar45;
      auVar139._0_4_ = iVar45;
      auVar139._8_4_ = iVar45;
      auVar139._12_4_ = iVar45;
      auVar160 = pmulld(auVar159,auVar139);
      auVar70._4_4_ = iVar19;
      auVar70._0_4_ = iVar19;
      auVar70._8_4_ = iVar19;
      auVar70._12_4_ = iVar19;
      auVar70 = pmulld(auVar96,auVar70);
      auVar97._4_4_ = uVar20;
      auVar97._0_4_ = uVar20;
      auVar97._8_4_ = uVar20;
      auVar97._12_4_ = uVar20;
      auVar139 = pmulld(auVar147,auVar97);
      auVar97 = pmulld(auVar96,auVar97);
      auVar148._4_4_ = iVar46;
      auVar148._0_4_ = iVar46;
      auVar148._8_4_ = iVar46;
      auVar148._12_4_ = iVar46;
      auVar148 = pmulld(auVar147,auVar148);
      auVar55._4_4_ = iVar111 - iVar77;
      auVar55._0_4_ = iVar104 - iVar74;
      auVar55._8_4_ = iVar115 - iVar61;
      auVar55._12_4_ = iVar119 - iVar62;
      auVar140._4_4_ = iVar21;
      auVar140._0_4_ = iVar21;
      auVar140._8_4_ = iVar21;
      auVar140._12_4_ = iVar21;
      auVar149 = pmulld(auVar55,auVar140);
      auVar59._4_4_ = iVar112 - iVar150;
      auVar59._0_4_ = iVar110 - iVar144;
      auVar59._8_4_ = iVar116 - iVar151;
      auVar59._12_4_ = iVar120 - iVar152;
      auVar85._4_4_ = uVar22;
      auVar85._0_4_ = uVar22;
      auVar85._8_4_ = uVar22;
      auVar85._12_4_ = uVar22;
      auVar140 = pmulld(auVar59,auVar85);
      auVar85 = pmulld(auVar55,auVar85);
      auVar161._4_4_ = iVar47;
      auVar161._0_4_ = iVar47;
      auVar161._8_4_ = iVar47;
      auVar161._12_4_ = iVar47;
      auVar55 = pmulld(auVar59,auVar161);
      auVar65._4_4_ = iVar113 - iVar76;
      auVar65._0_4_ = iVar114 - iVar98;
      auVar65._8_4_ = iVar117 - iVar100;
      auVar65._12_4_ = iVar121 - iVar102;
      auVar164._4_4_ = iVar23;
      auVar164._0_4_ = iVar23;
      auVar164._8_4_ = iVar23;
      auVar164._12_4_ = iVar23;
      auVar164 = pmulld(auVar65,auVar164);
      auVar66._4_4_ = iVar156 - iVar78;
      auVar66._0_4_ = iVar118 - iVar75;
      auVar66._8_4_ = iVar157 - iVar73;
      auVar66._12_4_ = iVar158 - iVar92;
      auVar153._4_4_ = uVar24;
      auVar153._0_4_ = uVar24;
      auVar153._8_4_ = uVar24;
      auVar153._12_4_ = uVar24;
      auVar161 = pmulld(auVar66,auVar153);
      auVar59 = pmulld(auVar65,auVar153);
      auVar145._4_4_ = iVar48;
      auVar145._0_4_ = iVar48;
      auVar145._8_4_ = iVar48;
      auVar145._12_4_ = iVar48;
      auVar66 = pmulld(auVar66,auVar145);
      auVar94._4_4_ = iVar127 - iVar99;
      auVar94._0_4_ = iVar122 - iVar93;
      auVar94._8_4_ = iVar128 - iVar101;
      auVar94._12_4_ = iVar129 - iVar103;
      auVar135._4_4_ = iVar25;
      auVar135._0_4_ = iVar25;
      auVar135._8_4_ = iVar25;
      auVar135._12_4_ = iVar25;
      auVar135 = pmulld(auVar94,auVar135);
      auVar131._4_4_ = uVar26;
      auVar131._0_4_ = uVar26;
      auVar131._8_4_ = uVar26;
      auVar131._12_4_ = uVar26;
      auVar145 = pmulld(auVar60,auVar131);
      auVar131 = pmulld(auVar94,auVar131);
      auVar125._4_4_ = iVar49;
      auVar125._0_4_ = iVar49;
      auVar125._8_4_ = iVar49;
      auVar125._12_4_ = iVar49;
      auVar94 = pmulld(auVar60,auVar125);
      auVar56._4_4_ = iVar86 - iVar64;
      auVar56._0_4_ = iVar79 - iVar63;
      auVar56._8_4_ = iVar88 - iVar71;
      auVar56._12_4_ = iVar90 - iVar72;
      auVar124._4_4_ = uVar27;
      auVar124._0_4_ = uVar27;
      auVar124._8_4_ = uVar27;
      auVar124._12_4_ = uVar27;
      auVar125 = pmulld(auVar56,auVar124);
      auVar82._4_4_ = uVar28;
      auVar82._0_4_ = uVar28;
      auVar82._8_4_ = uVar28;
      auVar82._12_4_ = uVar28;
      auVar65 = pmulld(auVar82,auVar132);
      auVar82 = pmulld(auVar56,auVar82);
      auVar56 = pmulld(auVar132,auVar124);
      piVar1 = (int *)((long)*out + lVar40);
      *piVar1 = auVar138._0_4_ + iVar41 + auVar155._0_4_ >> auVar162;
      piVar1[1] = auVar138._4_4_ + iVar41 + auVar155._4_4_ >> auVar162;
      piVar1[2] = auVar138._8_4_ + iVar41 + auVar155._8_4_ >> auVar162;
      piVar1[3] = auVar138._12_4_ + iVar41 + auVar155._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[uVar29] + lVar40);
      *piVar1 = (auVar125._0_4_ + iVar41) - auVar65._0_4_ >> auVar162;
      piVar1[1] = (auVar125._4_4_ + iVar41) - auVar65._4_4_ >> auVar162;
      piVar1[2] = (auVar125._8_4_ + iVar41) - auVar65._8_4_ >> auVar162;
      piVar1[3] = (auVar125._12_4_ + iVar41) - auVar65._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[(uint)(num_cols * 2)] + lVar40);
      *piVar1 = auVar167._0_4_ + iVar41 + auVar84._0_4_ >> auVar162;
      piVar1[1] = auVar167._4_4_ + iVar41 + auVar84._4_4_ >> auVar162;
      piVar1[2] = auVar167._8_4_ + iVar41 + auVar84._8_4_ >> auVar162;
      piVar1[3] = auVar167._12_4_ + iVar41 + auVar84._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[(uint)(num_cols * 3)] + lVar40);
      *piVar1 = auVar135._0_4_ + iVar41 + auVar145._0_4_ >> auVar162;
      piVar1[1] = auVar135._4_4_ + iVar41 + auVar145._4_4_ >> auVar162;
      piVar1[2] = auVar135._8_4_ + iVar41 + auVar145._8_4_ >> auVar162;
      piVar1[3] = auVar135._12_4_ + iVar41 + auVar145._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[(uint)(num_cols * 4)] + lVar40);
      *piVar1 = auVar170._0_4_ + iVar41 + auVar160._0_4_ >> auVar162;
      piVar1[1] = auVar170._4_4_ + iVar41 + auVar160._4_4_ >> auVar162;
      piVar1[2] = auVar170._8_4_ + iVar41 + auVar160._8_4_ >> auVar162;
      piVar1[3] = auVar170._12_4_ + iVar41 + auVar160._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[(uint)(num_cols * 5)] + lVar40);
      *piVar1 = auVar164._0_4_ + iVar41 + auVar161._0_4_ >> auVar162;
      piVar1[1] = auVar164._4_4_ + iVar41 + auVar161._4_4_ >> auVar162;
      piVar1[2] = auVar164._8_4_ + iVar41 + auVar161._8_4_ >> auVar162;
      piVar1[3] = auVar164._12_4_ + iVar41 + auVar161._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[(uint)(num_cols * 6)] + lVar40);
      *piVar1 = auVar97._0_4_ + iVar41 + auVar148._0_4_ >> auVar162;
      piVar1[1] = auVar97._4_4_ + iVar41 + auVar148._4_4_ >> auVar162;
      piVar1[2] = auVar97._8_4_ + iVar41 + auVar148._8_4_ >> auVar162;
      piVar1[3] = auVar97._12_4_ + iVar41 + auVar148._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[(uint)(num_cols * 7)] + lVar40);
      *piVar1 = auVar149._0_4_ + iVar41 + auVar140._0_4_ >> auVar162;
      piVar1[1] = auVar149._4_4_ + iVar41 + auVar140._4_4_ >> auVar162;
      piVar1[2] = auVar149._8_4_ + iVar41 + auVar140._8_4_ >> auVar162;
      piVar1[3] = auVar149._12_4_ + iVar41 + auVar140._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[(uint)(num_cols * 8)] + lVar40);
      *piVar1 = auVar85._0_4_ + iVar41 + auVar55._0_4_ >> auVar162;
      piVar1[1] = auVar85._4_4_ + iVar41 + auVar55._4_4_ >> auVar162;
      piVar1[2] = auVar85._8_4_ + iVar41 + auVar55._8_4_ >> auVar162;
      piVar1[3] = auVar85._12_4_ + iVar41 + auVar55._12_4_ >> auVar162;
      puVar3 = (undefined8 *)((long)out[(uint)(num_cols * 9)] + lVar40);
      *puVar3 = CONCAT44(auVar70._4_4_ + iVar41 + auVar139._4_4_ >> auVar162,
                         auVar70._0_4_ + iVar41 + auVar139._0_4_ >> auVar162);
      puVar3[1] = CONCAT44(auVar70._12_4_ + iVar41 + auVar139._12_4_ >> auVar162,
                           auVar70._8_4_ + iVar41 + auVar139._8_4_ >> auVar162);
      piVar1 = (int *)((long)out[(uint)(num_cols * 10)] + lVar40);
      *piVar1 = auVar59._0_4_ + iVar41 + auVar66._0_4_ >> auVar162;
      piVar1[1] = auVar59._4_4_ + iVar41 + auVar66._4_4_ >> auVar162;
      piVar1[2] = auVar59._8_4_ + iVar41 + auVar66._8_4_ >> auVar162;
      piVar1[3] = auVar59._12_4_ + iVar41 + auVar66._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[(uint)(num_cols * 0xb)] + lVar40);
      *piVar1 = auVar69._0_4_ + iVar41 + auVar109._0_4_ >> auVar162;
      piVar1[1] = auVar69._4_4_ + iVar41 + auVar109._4_4_ >> auVar162;
      piVar1[2] = auVar69._8_4_ + iVar41 + auVar109._8_4_ >> auVar162;
      piVar1[3] = auVar69._12_4_ + iVar41 + auVar109._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[(uint)(num_cols * 0xc)] + lVar40);
      *piVar1 = auVar131._0_4_ + iVar41 + auVar94._0_4_ >> auVar162;
      piVar1[1] = auVar131._4_4_ + iVar41 + auVar94._4_4_ >> auVar162;
      piVar1[2] = auVar131._8_4_ + iVar41 + auVar94._8_4_ >> auVar162;
      piVar1[3] = auVar131._12_4_ + iVar41 + auVar94._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[(uint)(num_cols * 0xd)] + lVar40);
      *piVar1 = auVar106._0_4_ + iVar41 + auVar108._0_4_ >> auVar162;
      piVar1[1] = auVar106._4_4_ + iVar41 + auVar108._4_4_ >> auVar162;
      piVar1[2] = auVar106._8_4_ + iVar41 + auVar108._8_4_ >> auVar162;
      piVar1[3] = auVar106._12_4_ + iVar41 + auVar108._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[(uint)(num_cols * 0xe)] + lVar40);
      *piVar1 = auVar82._0_4_ + iVar41 + auVar56._0_4_ >> auVar162;
      piVar1[1] = auVar82._4_4_ + iVar41 + auVar56._4_4_ >> auVar162;
      piVar1[2] = auVar82._8_4_ + iVar41 + auVar56._8_4_ >> auVar162;
      piVar1[3] = auVar82._12_4_ + iVar41 + auVar56._12_4_ >> auVar162;
      piVar1 = (int *)((long)out[(uint)(num_cols * 0xf)] + lVar40);
      *piVar1 = auVar67._0_4_ + iVar41 + auVar107._0_4_ >> auVar162;
      piVar1[1] = auVar67._4_4_ + iVar41 + auVar107._4_4_ >> auVar162;
      piVar1[2] = auVar67._8_4_ + iVar41 + auVar107._8_4_ >> auVar162;
      piVar1[3] = auVar67._12_4_ + iVar41 + auVar107._12_4_ >> auVar162;
      lVar40 = lVar40 + 0x10;
    } while (uVar29 * 0x10 != lVar40);
  }
  return;
}

Assistant:

static void fadst16x16_sse4_1(__m128i *in, __m128i *out, int bit,
                              const int num_cols) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospim2 = _mm_set1_epi32(-cospi[2]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospim10 = _mm_set1_epi32(-cospi[10]);
  const __m128i cospi18 = _mm_set1_epi32(cospi[18]);
  const __m128i cospi46 = _mm_set1_epi32(cospi[46]);
  const __m128i cospim18 = _mm_set1_epi32(-cospi[18]);
  const __m128i cospi26 = _mm_set1_epi32(cospi[26]);
  const __m128i cospi38 = _mm_set1_epi32(cospi[38]);
  const __m128i cospim26 = _mm_set1_epi32(-cospi[26]);
  const __m128i cospi34 = _mm_set1_epi32(cospi[34]);
  const __m128i cospi30 = _mm_set1_epi32(cospi[30]);
  const __m128i cospim34 = _mm_set1_epi32(-cospi[34]);
  const __m128i cospi42 = _mm_set1_epi32(cospi[42]);
  const __m128i cospi22 = _mm_set1_epi32(cospi[22]);
  const __m128i cospim42 = _mm_set1_epi32(-cospi[42]);
  const __m128i cospi50 = _mm_set1_epi32(cospi[50]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospi58 = _mm_set1_epi32(cospi[58]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i zero = _mm_setzero_si128();

  __m128i u[16], v[16], x, y;
  int col;

  for (col = 0; col < num_cols; ++col) {
    // stage 0
    // stage 1
    u[0] = in[0 * num_cols + col];
    u[1] = _mm_sub_epi32(zero, in[15 * num_cols + col]);
    u[2] = _mm_sub_epi32(zero, in[7 * num_cols + col]);
    u[3] = in[8 * num_cols + col];
    u[4] = _mm_sub_epi32(zero, in[3 * num_cols + col]);
    u[5] = in[12 * num_cols + col];
    u[6] = in[4 * num_cols + col];
    u[7] = _mm_sub_epi32(zero, in[11 * num_cols + col]);
    u[8] = _mm_sub_epi32(zero, in[1 * num_cols + col]);
    u[9] = in[14 * num_cols + col];
    u[10] = in[6 * num_cols + col];
    u[11] = _mm_sub_epi32(zero, in[9 * num_cols + col]);
    u[12] = in[2 * num_cols + col];
    u[13] = _mm_sub_epi32(zero, in[13 * num_cols + col]);
    u[14] = _mm_sub_epi32(zero, in[5 * num_cols + col]);
    u[15] = in[10 * num_cols + col];

    // stage 2
    v[0] = u[0];
    v[1] = u[1];

    x = _mm_mullo_epi32(u[2], cospi32);
    y = _mm_mullo_epi32(u[3], cospi32);
    v[2] = _mm_add_epi32(x, y);
    v[2] = _mm_add_epi32(v[2], rnding);
    v[2] = _mm_srai_epi32(v[2], bit);

    v[3] = _mm_sub_epi32(x, y);
    v[3] = _mm_add_epi32(v[3], rnding);
    v[3] = _mm_srai_epi32(v[3], bit);

    v[4] = u[4];
    v[5] = u[5];

    x = _mm_mullo_epi32(u[6], cospi32);
    y = _mm_mullo_epi32(u[7], cospi32);
    v[6] = _mm_add_epi32(x, y);
    v[6] = _mm_add_epi32(v[6], rnding);
    v[6] = _mm_srai_epi32(v[6], bit);

    v[7] = _mm_sub_epi32(x, y);
    v[7] = _mm_add_epi32(v[7], rnding);
    v[7] = _mm_srai_epi32(v[7], bit);

    v[8] = u[8];
    v[9] = u[9];

    x = _mm_mullo_epi32(u[10], cospi32);
    y = _mm_mullo_epi32(u[11], cospi32);
    v[10] = _mm_add_epi32(x, y);
    v[10] = _mm_add_epi32(v[10], rnding);
    v[10] = _mm_srai_epi32(v[10], bit);

    v[11] = _mm_sub_epi32(x, y);
    v[11] = _mm_add_epi32(v[11], rnding);
    v[11] = _mm_srai_epi32(v[11], bit);

    v[12] = u[12];
    v[13] = u[13];

    x = _mm_mullo_epi32(u[14], cospi32);
    y = _mm_mullo_epi32(u[15], cospi32);
    v[14] = _mm_add_epi32(x, y);
    v[14] = _mm_add_epi32(v[14], rnding);
    v[14] = _mm_srai_epi32(v[14], bit);

    v[15] = _mm_sub_epi32(x, y);
    v[15] = _mm_add_epi32(v[15], rnding);
    v[15] = _mm_srai_epi32(v[15], bit);

    // stage 3
    u[0] = _mm_add_epi32(v[0], v[2]);
    u[1] = _mm_add_epi32(v[1], v[3]);
    u[2] = _mm_sub_epi32(v[0], v[2]);
    u[3] = _mm_sub_epi32(v[1], v[3]);
    u[4] = _mm_add_epi32(v[4], v[6]);
    u[5] = _mm_add_epi32(v[5], v[7]);
    u[6] = _mm_sub_epi32(v[4], v[6]);
    u[7] = _mm_sub_epi32(v[5], v[7]);
    u[8] = _mm_add_epi32(v[8], v[10]);
    u[9] = _mm_add_epi32(v[9], v[11]);
    u[10] = _mm_sub_epi32(v[8], v[10]);
    u[11] = _mm_sub_epi32(v[9], v[11]);
    u[12] = _mm_add_epi32(v[12], v[14]);
    u[13] = _mm_add_epi32(v[13], v[15]);
    u[14] = _mm_sub_epi32(v[12], v[14]);
    u[15] = _mm_sub_epi32(v[13], v[15]);

    // stage 4
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = half_btf_sse4_1(&cospi16, &u[4], &cospi48, &u[5], &rnding, bit);
    v[5] = half_btf_sse4_1(&cospi48, &u[4], &cospim16, &u[5], &rnding, bit);
    v[6] = half_btf_sse4_1(&cospim48, &u[6], &cospi16, &u[7], &rnding, bit);
    v[7] = half_btf_sse4_1(&cospi16, &u[6], &cospi48, &u[7], &rnding, bit);
    v[8] = u[8];
    v[9] = u[9];
    v[10] = u[10];
    v[11] = u[11];
    v[12] = half_btf_sse4_1(&cospi16, &u[12], &cospi48, &u[13], &rnding, bit);
    v[13] = half_btf_sse4_1(&cospi48, &u[12], &cospim16, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospim48, &u[14], &cospi16, &u[15], &rnding, bit);
    v[15] = half_btf_sse4_1(&cospi16, &u[14], &cospi48, &u[15], &rnding, bit);

    // stage 5
    u[0] = _mm_add_epi32(v[0], v[4]);
    u[1] = _mm_add_epi32(v[1], v[5]);
    u[2] = _mm_add_epi32(v[2], v[6]);
    u[3] = _mm_add_epi32(v[3], v[7]);
    u[4] = _mm_sub_epi32(v[0], v[4]);
    u[5] = _mm_sub_epi32(v[1], v[5]);
    u[6] = _mm_sub_epi32(v[2], v[6]);
    u[7] = _mm_sub_epi32(v[3], v[7]);
    u[8] = _mm_add_epi32(v[8], v[12]);
    u[9] = _mm_add_epi32(v[9], v[13]);
    u[10] = _mm_add_epi32(v[10], v[14]);
    u[11] = _mm_add_epi32(v[11], v[15]);
    u[12] = _mm_sub_epi32(v[8], v[12]);
    u[13] = _mm_sub_epi32(v[9], v[13]);
    u[14] = _mm_sub_epi32(v[10], v[14]);
    u[15] = _mm_sub_epi32(v[11], v[15]);

    // stage 6
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];
    v[8] = half_btf_sse4_1(&cospi8, &u[8], &cospi56, &u[9], &rnding, bit);
    v[9] = half_btf_sse4_1(&cospi56, &u[8], &cospim8, &u[9], &rnding, bit);
    v[10] = half_btf_sse4_1(&cospi40, &u[10], &cospi24, &u[11], &rnding, bit);
    v[11] = half_btf_sse4_1(&cospi24, &u[10], &cospim40, &u[11], &rnding, bit);
    v[12] = half_btf_sse4_1(&cospim56, &u[12], &cospi8, &u[13], &rnding, bit);
    v[13] = half_btf_sse4_1(&cospi8, &u[12], &cospi56, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospim24, &u[14], &cospi40, &u[15], &rnding, bit);
    v[15] = half_btf_sse4_1(&cospi40, &u[14], &cospi24, &u[15], &rnding, bit);

    // stage 7
    u[0] = _mm_add_epi32(v[0], v[8]);
    u[1] = _mm_add_epi32(v[1], v[9]);
    u[2] = _mm_add_epi32(v[2], v[10]);
    u[3] = _mm_add_epi32(v[3], v[11]);
    u[4] = _mm_add_epi32(v[4], v[12]);
    u[5] = _mm_add_epi32(v[5], v[13]);
    u[6] = _mm_add_epi32(v[6], v[14]);
    u[7] = _mm_add_epi32(v[7], v[15]);
    u[8] = _mm_sub_epi32(v[0], v[8]);
    u[9] = _mm_sub_epi32(v[1], v[9]);
    u[10] = _mm_sub_epi32(v[2], v[10]);
    u[11] = _mm_sub_epi32(v[3], v[11]);
    u[12] = _mm_sub_epi32(v[4], v[12]);
    u[13] = _mm_sub_epi32(v[5], v[13]);
    u[14] = _mm_sub_epi32(v[6], v[14]);
    u[15] = _mm_sub_epi32(v[7], v[15]);

    // stage 8
    v[0] = half_btf_sse4_1(&cospi2, &u[0], &cospi62, &u[1], &rnding, bit);
    v[1] = half_btf_sse4_1(&cospi62, &u[0], &cospim2, &u[1], &rnding, bit);
    v[2] = half_btf_sse4_1(&cospi10, &u[2], &cospi54, &u[3], &rnding, bit);
    v[3] = half_btf_sse4_1(&cospi54, &u[2], &cospim10, &u[3], &rnding, bit);
    v[4] = half_btf_sse4_1(&cospi18, &u[4], &cospi46, &u[5], &rnding, bit);
    v[5] = half_btf_sse4_1(&cospi46, &u[4], &cospim18, &u[5], &rnding, bit);
    v[6] = half_btf_sse4_1(&cospi26, &u[6], &cospi38, &u[7], &rnding, bit);
    v[7] = half_btf_sse4_1(&cospi38, &u[6], &cospim26, &u[7], &rnding, bit);
    v[8] = half_btf_sse4_1(&cospi34, &u[8], &cospi30, &u[9], &rnding, bit);
    v[9] = half_btf_sse4_1(&cospi30, &u[8], &cospim34, &u[9], &rnding, bit);
    v[10] = half_btf_sse4_1(&cospi42, &u[10], &cospi22, &u[11], &rnding, bit);
    v[11] = half_btf_sse4_1(&cospi22, &u[10], &cospim42, &u[11], &rnding, bit);
    v[12] = half_btf_sse4_1(&cospi50, &u[12], &cospi14, &u[13], &rnding, bit);
    v[13] = half_btf_sse4_1(&cospi14, &u[12], &cospim50, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospi58, &u[14], &cospi6, &u[15], &rnding, bit);
    v[15] = half_btf_sse4_1(&cospi6, &u[14], &cospim58, &u[15], &rnding, bit);

    // stage 9
    out[0 * num_cols + col] = v[1];
    out[1 * num_cols + col] = v[14];
    out[2 * num_cols + col] = v[3];
    out[3 * num_cols + col] = v[12];
    out[4 * num_cols + col] = v[5];
    out[5 * num_cols + col] = v[10];
    out[6 * num_cols + col] = v[7];
    out[7 * num_cols + col] = v[8];
    out[8 * num_cols + col] = v[9];
    out[9 * num_cols + col] = v[6];
    out[10 * num_cols + col] = v[11];
    out[11 * num_cols + col] = v[4];
    out[12 * num_cols + col] = v[13];
    out[13 * num_cols + col] = v[2];
    out[14 * num_cols + col] = v[15];
    out[15 * num_cols + col] = v[0];
  }
}